

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * jx9_context_alloc_chunk(jx9_context *pCtx,uint nByte,int ZeroChunk,int AutoRelease)

{
  void *local_30;
  jx9_aux_data sAux;
  void *pChunk;
  int AutoRelease_local;
  int ZeroChunk_local;
  uint nByte_local;
  jx9_context *pCtx_local;
  
  sAux.pAuxData = SyMemBackendAlloc(&pCtx->pVm->sAllocator,nByte);
  if (sAux.pAuxData != (void *)0x0) {
    if (ZeroChunk != 0) {
      SyZero(sAux.pAuxData,nByte);
    }
    if (AutoRelease != 0) {
      local_30 = sAux.pAuxData;
      SySetPut(&pCtx->sChunk,&local_30);
    }
  }
  return sAux.pAuxData;
}

Assistant:

JX9_PRIVATE void * jx9_context_alloc_chunk(jx9_context *pCtx, unsigned int nByte, int ZeroChunk, int AutoRelease)
{
	void *pChunk;
	pChunk = SyMemBackendAlloc(&pCtx->pVm->sAllocator, nByte);
	if( pChunk ){
		if( ZeroChunk ){
			/* Zero the memory chunk */
			SyZero(pChunk, nByte);
		}
		if( AutoRelease ){
			jx9_aux_data sAux;
			/* Track the chunk so that it can be released automatically 
			 * upon this context is destroyed.
			 */
			sAux.pAuxData = pChunk;
			SySetPut(&pCtx->sChunk, (const void *)&sAux);
		}
	}
	return pChunk;
}